

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O1

void testReadMeta(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  char *in_RCX;
  char *expr;
  exr_context_t f;
  float dlev;
  int zlev;
  uint32_t verflags;
  void *udata;
  uint64_t cto;
  exr_attribute_t *newattr;
  string fn;
  int partidx;
  exr_context_initializer_t cinit;
  undefined8 local_e0;
  float local_d4;
  int local_d0;
  int local_cc;
  long local_c8;
  long local_c0;
  undefined1 local_b8 [8];
  long *local_b0 [2];
  long local_a0 [2];
  char local_8c [4];
  undefined8 local_88;
  code *pcStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,"");
  std::__cxx11::string::append((char *)local_b0);
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_28 = 0;
  local_88 = 0x68;
  uStack_30 = 0xbf800000fffffffe;
  pcStack_80 = err_cb;
  iVar1 = exr_test_file_header(local_b0[0]);
  if (iVar1 == 0) {
    iVar1 = exr_start_read(&local_e0,local_b0[0],&local_88);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 != (char *)0x0) goto LAB_0014597d;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00145993;
    }
    iVar1 = exr_get_file_version_and_flags(0,0);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 != (char *)0x0) goto LAB_001459d2;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001459e8;
    }
    iVar1 = exr_get_file_version_and_flags(local_e0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(3);
      if (pcVar3 != (char *)0x0) goto LAB_0014636e;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00146384;
    }
    iVar1 = exr_get_file_version_and_flags(local_e0,&local_cc);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_file_version_and_flags (f, &verflags)",(char *)0x8b,0x34e2ab,in_RCX);
LAB_00145b2b:
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00145b41:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(2);
      if (pcVar3 != (char *)0x0) goto LAB_001463c3;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001463d9;
    }
    if (local_cc != 2) {
      pcVar3 = (char *)0x8c;
      expr = "verflags == 2";
LAB_001453ac:
      iVar1 = 0;
      core_test_fail(expr,pcVar3,0x34e2ab,in_RCX);
LAB_001453b8:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
LAB_00145d88:
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(8);
      if (pcVar3 != (char *)0x0) goto LAB_00146517;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014652d;
    }
    iVar1 = exr_get_chunk_table_offset(0,0,0);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 != (char *)0x0) goto LAB_00145b2b;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00145b41;
    }
    iVar1 = exr_get_chunk_table_offset(local_e0,0xffffffff,0);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(4);
      if (pcVar3 != (char *)0x0) goto LAB_00146418;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014642e;
    }
    iVar1 = exr_get_chunk_table_offset(local_e0,2,0);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(4);
      if (pcVar3 != (char *)0x0) goto LAB_0014646d;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00146483;
    }
    iVar1 = exr_get_chunk_table_offset(local_e0,0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(3);
      if (pcVar3 != (char *)0x0) goto LAB_001464c2;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001464d8;
    }
    iVar1 = exr_get_chunk_table_offset(local_e0,0,&local_c0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_chunk_table_offset (f, 0, &cto)",(char *)0x9b,0x34e2ab,in_RCX);
      goto LAB_00145d88;
    }
    if (local_c0 != 0x14b) {
      pcVar3 = (char *)0x9c;
      expr = "cto == 331";
      goto LAB_001453ac;
    }
    in_RCX = "box2i";
    iVar1 = exr_attr_declare_by_type(local_e0,0,"foo","box2i",local_b8);
    if (iVar1 != 8) goto LAB_001453b8;
    in_RCX = (char *)0x1;
    iVar1 = exr_attr_declare(local_e0,0,"bar",1,local_b8);
    if (iVar1 != 8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(8);
      if (pcVar3 != (char *)0x0) goto LAB_0014656c;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00146582;
    }
    in_RCX = local_8c;
    iVar1 = exr_add_part(local_e0,"beauty",1);
    if (iVar1 != 8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(8);
      if (pcVar3 != (char *)0x0) goto LAB_001465c1;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001465d7;
    }
    iVar1 = exr_set_longname_support(local_e0,0);
    if (iVar1 != 8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(8);
      if (pcVar3 != (char *)0x0) goto LAB_00146616;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014662c;
    }
    iVar1 = exr_set_longname_support(local_e0,1);
    if (iVar1 != 8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(8);
      if (pcVar3 != (char *)0x0) goto LAB_0014666b;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00146681;
    }
    local_c8 = 3;
    iVar1 = exr_get_user_data(0);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(2);
      if (pcVar3 != (char *)0x0) goto LAB_001466c0;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001466d6;
    }
    iVar1 = exr_get_user_data(local_e0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(3);
      if (pcVar3 != (char *)0x0) goto LAB_00146715;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014672b;
    }
    local_c8 = 3;
    iVar1 = exr_get_user_data(local_e0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_user_data (f, &udata)",(char *)0xb5,0x34e2ab,in_RCX);
LAB_0014616b:
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00146181:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_zip_compression_level (f, 0, &zlev)",(char *)0xb9,0x34e2ab,in_RCX);
LAB_001461c0:
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_001461d6:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(8);
      if (pcVar3 != (char *)0x0) goto LAB_0014676a;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00146780;
    }
    if (local_c8 != 0) {
      core_test_fail("udata == __null",(char *)0xb6,0x34e2ab,in_RCX);
      iVar1 = 0;
LAB_00145740:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 != (char *)0x0) goto LAB_0014616b;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00146181;
    }
    local_d0 = -2;
    iVar1 = exr_get_zip_compression_level(local_e0,0);
    if (iVar1 != 0) goto LAB_00145740;
    if (local_d0 != -1) {
      core_test_fail("zlev == -1",(char *)0xba,0x34e2ab,in_RCX);
      iVar1 = 0;
LAB_001457c6:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 != (char *)0x0) goto LAB_001461c0;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001461d6;
    }
    iVar1 = exr_set_zip_compression_level(local_e0,0,4);
    if (iVar1 != 8) goto LAB_001457c6;
    local_d4 = -3.0;
    iVar1 = exr_get_dwa_compression_level(local_e0,0);
    if (iVar1 == 0) {
      if ((local_d4 != 45.0) || (NAN(local_d4))) {
        core_test_fail("dlev == 45.f",(char *)0xc0,0x34e2ab,in_RCX);
        iVar1 = 0;
      }
      else {
        iVar1 = exr_set_dwa_compression_level(0x42280000,local_e0,0);
        if (iVar1 == 8) {
          exr_finish(&local_e0);
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          return;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 != (char *)0x0) goto LAB_00146297;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_dwa_compression_level (f, 0, &dlev)",(char *)0xbf,0x34e2ab,in_RCX);
LAB_00146297:
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(8);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001467d5;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_test_file_header (fn.c_str (), &cinit)",(char *)0x82,0x34e2ab,in_RCX);
LAB_0014597d:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00145993:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x83,0x34e2ab,in_RCX);
LAB_001459d2:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_001459e8:
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar3 = (char *)exr_get_default_error_message(2);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_file_version_and_flags (__null, __null)",(char *)0x86,0x34e2ab,in_RCX);
LAB_0014636e:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00146384:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_file_version_and_flags (f, __null)",(char *)0x89,0x34e2ab,in_RCX);
LAB_001463c3:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_001463d9:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_table_offset (__null, 0, __null)",(char *)0x90,0x34e2ab,in_RCX);
LAB_00146418:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0014642e:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_table_offset (f, -1, __null)",(char *)0x93,0x34e2ab,in_RCX);
LAB_0014646d:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00146483:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_table_offset (f, 2, __null)",(char *)0x96,0x34e2ab,in_RCX);
LAB_001464c2:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_001464d8:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_table_offset (f, 0, __null)",(char *)0x99,0x34e2ab,in_RCX);
LAB_00146517:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0014652d:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_declare_by_type (f, 0, \"foo\", \"box2i\", &newattr)",(char *)0xa0,
                   0x34e2ab,in_RCX);
LAB_0014656c:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00146582:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_attr_declare (f, 0, \"bar\", EXR_ATTR_BOX2I, &newattr)",(char *)0xa3,
                   0x34e2ab,in_RCX);
LAB_001465c1:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_001465d7:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_add_part (f, \"beauty\", EXR_STORAGE_TILED, &partidx)",(char *)0xa8,0x34e2ab
                   ,in_RCX);
LAB_00146616:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0014662c:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_set_longname_support (f, 0)",(char *)0xab,0x34e2ab,in_RCX);
LAB_0014666b:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00146681:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_set_longname_support (f, 1)",(char *)0xad,0x34e2ab,in_RCX);
LAB_001466c0:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_001466d6:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_user_data (__null, &udata)",(char *)0xb1,0x34e2ab,in_RCX);
LAB_00146715:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_0014672b:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_user_data (f, __null)",(char *)0xb3,0x34e2ab,in_RCX);
LAB_0014676a:
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_00146780:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_set_zip_compression_level (f, 0, 4)",(char *)0xbc,0x34e2ab,in_RCX);
  }
  sVar4 = strlen(pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar4);
LAB_001467d5:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  core_test_fail("exr_set_dwa_compression_level (f, 0, 42.f)",(char *)0xc2,0x34e2ab,in_RCX);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenScans (const std::string& tempdir)
{
    exr_context_t f;
    std::string   fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.1.exr";

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.planar.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.interleaved.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}